

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall glslang::TParseContext::setPrecisionDefaults(TParseContext *this)

{
  TPrecisionQualifier *__s;
  TPrecisionQualifier *pTVar1;
  EProfile EVar2;
  uint uVar3;
  long lVar4;
  TParseContext *this_00;
  TSampler local_24;
  
  this->defaultPrecision[0x18] = EpqNone;
  this->defaultPrecision[0x19] = EpqNone;
  this->defaultPrecision[0x1a] = EpqNone;
  this->defaultPrecision[0x1b] = EpqNone;
  this->defaultPrecision[0x14] = EpqNone;
  this->defaultPrecision[0x15] = EpqNone;
  this->defaultPrecision[0x16] = EpqNone;
  this->defaultPrecision[0x17] = EpqNone;
  this->defaultPrecision[0x10] = EpqNone;
  this->defaultPrecision[0x11] = EpqNone;
  this->defaultPrecision[0x12] = EpqNone;
  this->defaultPrecision[0x13] = EpqNone;
  this->defaultPrecision[0xc] = EpqNone;
  this->defaultPrecision[0xd] = EpqNone;
  this->defaultPrecision[0xe] = EpqNone;
  this->defaultPrecision[0xf] = EpqNone;
  this->defaultPrecision[8] = EpqNone;
  this->defaultPrecision[9] = EpqNone;
  this->defaultPrecision[10] = EpqNone;
  this->defaultPrecision[0xb] = EpqNone;
  this->defaultPrecision[4] = EpqNone;
  this->defaultPrecision[5] = EpqNone;
  this->defaultPrecision[6] = EpqNone;
  this->defaultPrecision[7] = EpqNone;
  this->defaultPrecision[0] = EpqNone;
  this->defaultPrecision[1] = EpqNone;
  this->defaultPrecision[2] = EpqNone;
  this->defaultPrecision[3] = EpqNone;
  __s = this->defaultSamplerPrecision;
  this_00 = (TParseContext *)__s;
  memset(__s,0,0x7e00);
  if ((this->precisionManager).obey == true) {
    if ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) {
      uVar3 = computeSamplerTypeIndex(this_00,&local_24);
      __s[uVar3] = EpqLow;
      uVar3 = computeSamplerTypeIndex(this_00,&local_24);
      __s[uVar3] = EpqLow;
      uVar3 = computeSamplerTypeIndex(this_00,&local_24);
      __s[uVar3] = EpqLow;
    }
    if ((this->super_TParseContextBase).parsingBuiltins == false) {
      EVar2 = (this->super_TParseContextBase).super_TParseVersions.profile;
      if ((EVar2 == EEsProfile) &&
         ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment)) {
        this->defaultPrecision[8] = EpqMedium;
        this->defaultPrecision[9] = EpqMedium;
      }
      else {
        this->defaultPrecision[8] = EpqHigh;
        this->defaultPrecision[9] = EpqHigh;
        this->defaultPrecision[1] = EpqHigh;
        if (EVar2 != EEsProfile) {
          lVar4 = 0;
          do {
            pTVar1 = __s + lVar4;
            pTVar1[0] = EpqHigh;
            pTVar1[1] = EpqHigh;
            pTVar1[2] = EpqHigh;
            pTVar1[3] = EpqHigh;
            lVar4 = lVar4 + 4;
          } while (lVar4 != 0x1f80);
        }
      }
    }
    this->defaultPrecision[0xd] = EpqHigh;
    this->defaultPrecision[0xe] = EpqLow;
  }
  return;
}

Assistant:

void TParseContext::setPrecisionDefaults()
{
    // Set all precision defaults to EpqNone, which is correct for all types
    // when not obeying precision qualifiers, and correct for types that don't
    // have defaults (thus getting an error on use) when obeying precision
    // qualifiers.

    for (int type = 0; type < EbtNumTypes; ++type)
        defaultPrecision[type] = EpqNone;

    for (int type = 0; type < maxSamplerIndex; ++type)
        defaultSamplerPrecision[type] = EpqNone;

    // replace with real precision defaults for those that have them
    if (obeyPrecisionQualifiers()) {
        if (isEsProfile()) {
            // Most don't have defaults, a few default to lowp.
            TSampler sampler;
            sampler.set(EbtFloat, Esd2D);
            defaultSamplerPrecision[computeSamplerTypeIndex(sampler)] = EpqLow;
            sampler.set(EbtFloat, EsdCube);
            defaultSamplerPrecision[computeSamplerTypeIndex(sampler)] = EpqLow;
            sampler.set(EbtFloat, Esd2D);
            sampler.setExternal(true);
            defaultSamplerPrecision[computeSamplerTypeIndex(sampler)] = EpqLow;
        }

        // If we are parsing built-in computational variables/functions, it is meaningful to record
        // whether the built-in has no precision qualifier, as that ambiguity
        // is used to resolve the precision from the supplied arguments/operands instead.
        // So, we don't actually want to replace EpqNone with a default precision for built-ins.
        if (! parsingBuiltins) {
            if (isEsProfile() && language == EShLangFragment) {
                defaultPrecision[EbtInt] = EpqMedium;
                defaultPrecision[EbtUint] = EpqMedium;
            } else {
                defaultPrecision[EbtInt] = EpqHigh;
                defaultPrecision[EbtUint] = EpqHigh;
                defaultPrecision[EbtFloat] = EpqHigh;
            }

            if (!isEsProfile()) {
                // Non-ES profile
                // All sampler precisions default to highp.
                for (int type = 0; type < maxSamplerIndex; ++type)
                    defaultSamplerPrecision[type] = EpqHigh;
            }
        }

        defaultPrecision[EbtSampler] = EpqLow;
        defaultPrecision[EbtAtomicUint] = EpqHigh;
    }
}